

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O0

String * doctest::detail::stringifyBinaryExpr<short,short>(short *lhs,char *op,short *rhs)

{
  String *in_RDI;
  String *in_stack_ffffffffffffff70;
  String *in_stack_ffffffffffffffa0;
  undefined6 in_stack_ffffffffffffffa8;
  short in_stack_ffffffffffffffae;
  
  doctest::toString(in_stack_ffffffffffffffae);
  String::String(in_stack_ffffffffffffff70,(char *)in_RDI);
  String::operator+((String *)CONCAT26(in_stack_ffffffffffffffae,in_stack_ffffffffffffffa8),
                    in_stack_ffffffffffffffa0);
  doctest::toString(in_stack_ffffffffffffffae);
  String::operator+((String *)CONCAT26(in_stack_ffffffffffffffae,in_stack_ffffffffffffffa8),
                    in_stack_ffffffffffffffa0);
  String::~String(in_stack_ffffffffffffff70);
  String::~String(in_stack_ffffffffffffff70);
  String::~String(in_stack_ffffffffffffff70);
  String::~String(in_stack_ffffffffffffff70);
  return in_RDI;
}

Assistant:

String stringifyBinaryExpr(const DOCTEST_REF_WRAP(L) lhs, const char* op,
                               const DOCTEST_REF_WRAP(R) rhs) {
        // NOLINTNEXTLINE(clang-analyzer-cplusplus.NewDeleteLeaks)
        return toString(lhs) + op + toString(rhs);
    }